

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

int duckdb_lz4::LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  uint uVar1;
  LZ4_byte *pLVar2;
  dict_directive dVar3;
  BYTE *lowPrefix;
  ulong dictSize;
  size_t dictSize_00;
  
  dictSize = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (dictSize == 0) {
    pLVar2 = (BYTE *)0x0;
    dictSize = 0;
    dVar3 = noDict;
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (dictSize < 0xffff) {
        dictSize_00 = (LZ4_streamDecode->internal_donotuse).extDictSize;
        if (dictSize_00 == 0) {
          lowPrefix = (BYTE *)(dest + -dictSize);
          pLVar2 = (BYTE *)0x0;
          dictSize_00 = 0;
          dVar3 = noDict;
        }
        else {
          pLVar2 = (LZ4_streamDecode->internal_donotuse).externalDict;
          lowPrefix = (BYTE *)(dest + -dictSize);
          dVar3 = usingExtDict;
        }
      }
      else {
        lowPrefix = (BYTE *)(dest + -0x10000);
        pLVar2 = (BYTE *)0x0;
        dictSize_00 = 0;
        dVar3 = withPrefix64k;
      }
      uVar1 = LZ4_decompress_generic
                        (source,dest,compressedSize,maxOutputSize,decode_full_block,dVar3,lowPrefix,
                         pLVar2,dictSize_00);
      if ((int)uVar1 < 1) {
        return uVar1;
      }
      (LZ4_streamDecode->internal_donotuse).prefixSize =
           (LZ4_streamDecode->internal_donotuse).prefixSize + (ulong)uVar1;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar1;
      return uVar1;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = dictSize;
    pLVar2 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -dictSize;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar2;
    dVar3 = usingExtDict;
  }
  uVar1 = LZ4_decompress_generic
                    (source,dest,compressedSize,maxOutputSize,decode_full_block,dVar3,(BYTE *)dest,
                     pLVar2,dictSize);
  if (0 < (int)uVar1) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (ulong)uVar1;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar1);
  }
  return uVar1;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}